

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cpp
# Opt level: O2

void __thiscall PDA::Transducer::Tokenizer::printIdentifiers(Tokenizer *this)

{
  int iVar1;
  pointer pIVar2;
  long lVar3;
  wostream *pwVar4;
  wostream *this_00;
  Context cnt;
  Type extraout_EDX;
  Type extraout_EDX_00;
  Type extraout_EDX_01;
  Type extraout_EDX_02;
  Type tp;
  int iVar5;
  wstring *pwVar6;
  undefined1 auVar7 [12];
  wstring local_70;
  wstring local_50;
  
  pwVar4 = std::operator<<(&std::wcout,0x3d);
  *(undefined8 *)(pwVar4 + *(long *)(*(long *)pwVar4 + -0x18) + 0x10) = 0xbe;
  pwVar4 = std::operator<<(pwVar4,L'\n');
  std::operator<<(pwVar4,0x20);
  lVar3 = std::wcout;
  *(uint *)(std::locale::~locale + *(long *)(std::wcout + -0x18)) =
       *(uint *)(std::locale::~locale + *(long *)(std::wcout + -0x18)) & 0xffffff4f | 0x20;
  *(undefined8 *)(std::locale::global + *(long *)(lVar3 + -0x18)) = 5;
  pwVar4 = std::operator<<((wostream *)&std::wcout,L"ID");
  *(undefined8 *)(pwVar4 + *(long *)(*(long *)pwVar4 + -0x18) + 0x10) = 10;
  pwVar4 = std::operator<<(pwVar4,L"TYPE");
  *(undefined8 *)(pwVar4 + *(long *)(*(long *)pwVar4 + -0x18) + 0x10) = 0xf;
  pwVar4 = std::operator<<(pwVar4,L"CONTEXT");
  *(undefined8 *)(pwVar4 + *(long *)(*(long *)pwVar4 + -0x18) + 0x10) = 10;
  pwVar4 = std::operator<<(pwVar4,L"RBPOFFSET");
  *(undefined8 *)(pwVar4 + *(long *)(*(long *)pwVar4 + -0x18) + 0x10) = 10;
  pwVar4 = std::operator<<(pwVar4,L"NAME");
  *(undefined8 *)(pwVar4 + *(long *)(*(long *)pwVar4 + -0x18) + 0x10) = 0x14;
  pwVar4 = std::operator<<(pwVar4,L"DECORATED");
  *(undefined8 *)(pwVar4 + *(long *)(*(long *)pwVar4 + -0x18) + 0x10) = 0x1e;
  pwVar4 = std::operator<<(pwVar4,L"VALUE");
  *(undefined8 *)(pwVar4 + *(long *)(*(long *)pwVar4 + -0x18) + 0x10) = 10;
  pwVar4 = std::operator<<(pwVar4,L"RETTYPE");
  *(undefined8 *)(pwVar4 + *(long *)(*(long *)pwVar4 + -0x18) + 0x10) = 5;
  pwVar4 = std::operator<<(pwVar4,L"ROW");
  *(undefined8 *)(pwVar4 + *(long *)(*(long *)pwVar4 + -0x18) + 0x10) = 5;
  pwVar4 = std::operator<<(pwVar4,L"COL");
  *(undefined8 *)(pwVar4 + *(long *)(*(long *)pwVar4 + -0x18) + 0x10) = 0x50;
  pwVar4 = std::operator<<(pwVar4,L"FILENAME");
  std::endl<wchar_t,std::char_traits<wchar_t>>(pwVar4);
  pIVar2 = (this->m_identifiers).
           super__Vector_base<PDA::Transducer::Identifier,_std::allocator<PDA::Transducer::Identifier>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pwVar6 = (wstring *)
           &(((this->m_identifiers).
              super__Vector_base<PDA::Transducer::Identifier,_std::allocator<PDA::Transducer::Identifier>_>
              ._M_impl.super__Vector_impl_data._M_start)->value).stringValue;
  iVar5 = 0;
  do {
    if ((pointer)(pwVar6 + -0x58) == pIVar2) {
      pwVar4 = std::operator<<(&std::wcout,0x3d);
      *(undefined8 *)(pwVar4 + *(long *)(*(long *)pwVar4 + -0x18) + 0x10) = 0xbe;
      pwVar4 = std::operator<<(pwVar4,L' ');
      pwVar4 = std::operator<<(pwVar4,0x20);
      std::endl<wchar_t,std::char_traits<wchar_t>>(pwVar4);
      return;
    }
    *(undefined8 *)(std::locale::global + *(long *)(std::wcout + -0x18)) = 5;
    auVar7 = std::wostream::operator<<((wostream *)&std::wcout,iVar5);
    pwVar4 = auVar7._0_8_;
    *(undefined8 *)(pwVar4 + *(long *)(*(long *)pwVar4 + -0x18) + 0x10) = 10;
    Identifier::typeToString_abi_cxx11_
              (&local_70,(Identifier *)(ulong)*(uint *)(pwVar6 + -0x18),auVar7._8_4_);
    pwVar4 = std::operator<<(pwVar4,(wstring *)&local_70);
    *(undefined8 *)(pwVar4 + *(long *)(*(long *)pwVar4 + -0x18) + 0x10) = 0xf;
    Identifier::contextToString_abi_cxx11_
              (&local_50,(Identifier *)(ulong)*(uint *)(pwVar6 + -0x10),cnt);
    pwVar4 = std::operator<<(pwVar4,(wstring *)&local_50);
    *(undefined8 *)(pwVar4 + *(long *)(*(long *)pwVar4 + -0x18) + 0x10) = 10;
    pwVar4 = (wostream *)std::wostream::operator<<((wostream *)pwVar4,*(int *)(pwVar6 + 0x20));
    *(undefined8 *)(pwVar4 + *(long *)(*(long *)pwVar4 + -0x18) + 0x10) = 10;
    pwVar4 = std::operator<<(pwVar4,pwVar6 + -0x58);
    *(undefined8 *)(pwVar4 + *(long *)(*(long *)pwVar4 + -0x18) + 0x10) = 0x14;
    pwVar4 = std::operator<<(pwVar4,pwVar6 + -0x38);
    *(undefined8 *)(pwVar4 + *(long *)(*(long *)pwVar4 + -0x18) + 0x10) = 0x1e;
    std::__cxx11::wstring::~wstring((wstring *)&local_50);
    std::__cxx11::wstring::~wstring((wstring *)&local_70);
    if (*(int *)(pwVar6 + -0x10) == 4) {
      iVar1 = *(int *)(pwVar6 + -0x18);
      if (iVar1 - 1U < 2) {
        std::wostream::_M_insert<long_long>((longlong)&std::wcout);
        tp = extraout_EDX_01;
      }
      else if (iVar1 == 4) {
        std::wostream::_M_insert<double>(*(double *)(pwVar6 + -8));
        tp = extraout_EDX_02;
      }
      else {
        if (iVar1 != 3) goto LAB_00107192;
        std::operator<<((wostream *)&std::wcout,pwVar6);
        tp = extraout_EDX;
      }
    }
    else {
LAB_00107192:
      std::operator<<((wostream *)&std::wcout,L"");
      tp = extraout_EDX_00;
    }
    *(undefined8 *)(std::locale::global + *(long *)(std::wcout + -0x18)) = 10;
    Identifier::typeToString_abi_cxx11_(&local_70,(Identifier *)(ulong)*(uint *)(pwVar6 + -0x14),tp)
    ;
    pwVar4 = std::operator<<((wostream *)&std::wcout,(wstring *)&local_70);
    *(undefined8 *)(pwVar4 + *(long *)(*(long *)pwVar4 + -0x18) + 0x10) = 5;
    this_00 = (wostream *)
              std::wostream::operator<<
                        ((wostream *)pwVar4,
                         (this->m_tokens).
                         super__Vector_base<PDA::Transducer::Token,_std::allocator<PDA::Transducer::Token>_>
                         ._M_impl.super__Vector_impl_data._M_start[*(int *)(pwVar6 + 0x28)].line);
    *(undefined8 *)(this_00 + *(long *)(*(long *)this_00 + -0x18) + 0x10) = 5;
    pwVar4 = (wostream *)
             std::wostream::operator<<
                       (this_00,(this->m_tokens).
                                super__Vector_base<PDA::Transducer::Token,_std::allocator<PDA::Transducer::Token>_>
                                ._M_impl.super__Vector_impl_data._M_start[*(int *)(pwVar6 + 0x28)].
                                position - *(int *)(pwVar6 + -0x50));
    *(undefined8 *)(pwVar4 + *(long *)(*(long *)pwVar4 + -0x18) + 0x10) = 0x50;
    pwVar4 = std::operator<<(pwVar4,(wstring *)
                                    ((this->m_files).
                                     super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start +
                                    (this->m_tokens).
                                    super__Vector_base<PDA::Transducer::Token,_std::allocator<PDA::Transducer::Token>_>
                                    ._M_impl.super__Vector_impl_data._M_start
                                    [*(int *)(pwVar6 + 0x28)].fileIndex));
    std::endl<wchar_t,std::char_traits<wchar_t>>(pwVar4);
    std::__cxx11::wstring::~wstring((wstring *)&local_70);
    pwVar6 = pwVar6 + 0xa0;
    iVar5 = iVar5 + 1;
  } while( true );
}

Assistant:

void Tokenizer::printIdentifiers() const
{
    std::wcout << std::setfill(L'=') << std::setw(190) << L'\n' << std::setfill(L' ');
    std::wcout << std::left << std::setw(5) << L"ID" << std::setw(10) << L"TYPE" << std::setw(15) << L"CONTEXT" << std::setw(10) << L"RBPOFFSET" << std::setw(10) << L"NAME" << std::setw(20) << L"DECORATED"
               << std::setw(30) << L"VALUE" << std::setw(10) << L"RETTYPE" << std::setw(5) << L"ROW" << std::setw(5) << L"COL"
               << std::setw(80) << L"FILENAME" << std::endl;
    int id{0};
    for(const Identifier &identifier : m_identifiers)
    {
        std::wcout << std::setw(5) << id++ << std::setw(10) << Identifier::typeToString(identifier.type) << std::setw(15) << Identifier::contextToString(identifier.context)
                   << std::setw(10) << identifier.rbpOffset << std::setw(10) << identifier.name
                   << std::setw(20) << identifier.decoratedName << std::setw(30);
        if (identifier.context == Identifier::Context::Literal)
        {
            if (identifier.type == Identifier::Type::String)
                std::wcout << identifier.value.stringValue;
            else if (identifier.type == Identifier::Type::Integer || identifier.type == Identifier::Type::Bool)
                std::wcout << identifier.value.intValue;
            else if (identifier.type == Identifier::Type::Double)
                std::wcout << identifier.value.doubleValue;
            else
                std::wcout << L"";
        }
        else
            std::wcout << L"";

        std::wcout << std::setw(10) << Identifier::typeToString(identifier.returnType) << std::setw(5)
                   << m_tokens[static_cast<size_t>(identifier.tokenIndex)].line << std::setw(5)
                   << m_tokens[static_cast<size_t>(identifier.tokenIndex)].position - static_cast<int>(identifier.name.size())
                   << std::setw(80) <<  m_files[static_cast<size_t>(m_tokens[static_cast<size_t>(identifier.tokenIndex)].fileIndex)] << std::endl;
    }
    std::wcout << std::setfill(L'=') << std::setw(190) << L' ' << std::setfill(L' ') << std::endl;
}